

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O0

int CfdSetPsbtTxInUtxo(void *handle,void *psbt_handle,char *txid,uint32_t vout,int64_t amount,
                      char *locking_script,char *full_tx_hex)

{
  bool bVar1;
  undefined1 uVar2;
  undefined8 uVar3;
  uint32_t in_ECX;
  char *in_RDX;
  long in_RSI;
  int64_t in_R8;
  char *in_R9;
  char *in_stack_00000008;
  CfdException *except;
  exception *std_except;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> pubkeys;
  TxOut txout;
  Script script;
  Transaction tx;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  Script redeem_script;
  OutPoint outpoint;
  CfdCapiPsbtHandle *psbt_obj;
  int result;
  Transaction *in_stack_fffffffffffffbb0;
  Script *in_stack_fffffffffffffbb8;
  Psbt *in_stack_fffffffffffffbc0;
  Psbt *in_stack_fffffffffffffbc8;
  CfdError CVar4;
  OutPoint *outpoint_00;
  undefined6 in_stack_fffffffffffffbd0;
  undefined1 in_stack_fffffffffffffbd6;
  undefined1 in_stack_fffffffffffffbd7;
  Psbt *in_stack_fffffffffffffbd8;
  TxOutReference local_3a0;
  string *in_stack_fffffffffffffcb8;
  void *in_stack_fffffffffffffcc0;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_300;
  Amount local_2e8;
  TxOut local_2d8;
  allocator local_281;
  string local_280;
  Script local_260;
  allocator local_221;
  string local_220;
  Transaction local_200;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_1c0;
  Script local_1a8;
  allocator local_169;
  string local_168;
  Txid local_148;
  OutPoint local_128;
  undefined1 local_fa;
  allocator local_f9;
  string local_f8 [32];
  CfdSourceLocation local_d8;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [32];
  CfdSourceLocation local_98;
  long local_80;
  allocator local_71;
  string local_70 [52];
  undefined4 local_3c;
  char *local_38;
  int64_t local_30;
  uint32_t local_24;
  char *local_20;
  long local_18;
  int local_4;
  
  local_3c = 0xffffffff;
  local_38 = in_R9;
  local_30 = in_R8;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"PsbtHandle",&local_71);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  local_80 = local_18;
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (bVar1) {
    local_98.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    CVar4 = (CfdError)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
    local_98.filename = local_98.filename + 1;
    local_98.line = 0x323;
    local_98.funcname = "CfdSetPsbtTxInUtxo";
    cfd::core::logger::warn<>(&local_98,"txid is null or empty.");
    local_ba = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"Failed to parameter. txid is null or empty.",&local_b9);
    cfd::core::CfdException::CfdException
              ((CfdException *)
               CONCAT17(in_stack_fffffffffffffbd7,
                        CONCAT16(in_stack_fffffffffffffbd6,in_stack_fffffffffffffbd0)),CVar4,
               (string *)in_stack_fffffffffffffbc0);
    local_ba = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)(local_80 + 0x18) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_168,local_20,&local_169);
    cfd::core::Txid::Txid(&local_148,&local_168);
    cfd::core::OutPoint::OutPoint(&local_128,&local_148,local_24);
    cfd::core::Txid::~Txid((Txid *)0x5ecf75);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
    cfd::Psbt::GetTxInRedeemScript
              (in_stack_fffffffffffffbd8,
               (OutPoint *)
               CONCAT17(in_stack_fffffffffffffbd7,
                        CONCAT16(in_stack_fffffffffffffbd6,in_stack_fffffffffffffbd0)),
               SUB81((ulong)in_stack_fffffffffffffbc8 >> 0x38,0),(bool *)in_stack_fffffffffffffbc0);
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::vector(&local_1c0);
    bVar1 = cfd::capi::IsEmptyString(in_stack_00000008);
    if (bVar1) {
      bVar1 = cfd::capi::IsEmptyString(local_38);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_280,local_38,&local_281);
        cfd::core::Script::Script(&local_260,&local_280);
        std::__cxx11::string::~string((string *)&local_280);
        std::allocator<char>::~allocator((allocator<char> *)&local_281);
        cfd::core::Amount::Amount(&local_2e8,local_30);
        cfd::core::TxOut::TxOut(&local_2d8,&local_2e8,&local_260);
        cfd::Psbt::GetTxInKeyDataList
                  (in_stack_fffffffffffffbc8,(OutPoint *)in_stack_fffffffffffffbc0);
        uVar2 = cfd::core::Script::IsWitnessProgram(&local_260);
        if ((((bool)uVar2) ||
            (in_stack_fffffffffffffbd6 = cfd::core::Script::IsEmpty(&local_1a8),
            !(bool)in_stack_fffffffffffffbd6)) ||
           (bVar1 = std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::empty
                              (&local_300), !bVar1)) {
          outpoint_00 = *(OutPoint **)(local_80 + 0x18);
          cfd::core::TxOutReference::TxOutReference
                    ((TxOutReference *)&stack0xfffffffffffffcb0,&local_2d8);
          cfd::Psbt::SetTxInUtxo
                    ((Psbt *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffbd6,
                                                     in_stack_fffffffffffffbd0)),outpoint_00,
                     (TxOutReference *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                     (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
                     in_stack_fffffffffffffbb0);
          cfd::core::TxOutReference::~TxOutReference((TxOutReference *)0x5ed338);
        }
        else {
          in_stack_fffffffffffffbc0 = *(Psbt **)(local_80 + 0x18);
          cfd::core::TxOutReference::TxOutReference(&local_3a0,&local_2d8);
          cfd::Psbt::SetTxInWitnessUtxoDirect
                    (in_stack_fffffffffffffbc0,(OutPoint *)in_stack_fffffffffffffbb8,
                     (TxOutReference *)in_stack_fffffffffffffbb0);
          cfd::core::TxOutReference::~TxOutReference((TxOutReference *)0x5ed448);
        }
        std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
                  ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
                   in_stack_fffffffffffffbc0);
        cfd::core::TxOut::~TxOut((TxOut *)0x5ed487);
        cfd::core::Script::~Script((Script *)in_stack_fffffffffffffbb0);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_220,in_stack_00000008,&local_221);
      cfd::core::Transaction::Transaction(&local_200,&local_220);
      std::__cxx11::string::~string((string *)&local_220);
      std::allocator<char>::~allocator((allocator<char> *)&local_221);
      cfd::Psbt::SetTxInUtxo
                ((Psbt *)CONCAT17(in_stack_fffffffffffffbd7,
                                  CONCAT16(in_stack_fffffffffffffbd6,in_stack_fffffffffffffbd0)),
                 (OutPoint *)in_stack_fffffffffffffbc8,(Transaction *)in_stack_fffffffffffffbc0,
                 in_stack_fffffffffffffbb8,
                 (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
                 in_stack_fffffffffffffbb0);
      cfd::core::Transaction::~Transaction(in_stack_fffffffffffffbb0);
    }
    local_4 = 0;
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
               in_stack_fffffffffffffbc0);
    cfd::core::Script::~Script((Script *)in_stack_fffffffffffffbb0);
    cfd::core::OutPoint::~OutPoint((OutPoint *)0x5ed4f3);
    return local_4;
  }
  local_d8.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
               ,0x2f);
  CVar4 = (CfdError)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
  local_d8.filename = local_d8.filename + 1;
  local_d8.line = 0x329;
  local_d8.funcname = "CfdSetPsbtTxInUtxo";
  cfd::core::logger::warn<>(&local_d8,"psbt is null.");
  local_fa = 1;
  uVar3 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"Failed to handle statement. psbt is null.",&local_f9);
  cfd::core::CfdException::CfdException
            ((CfdException *)
             CONCAT17(in_stack_fffffffffffffbd7,
                      CONCAT16(in_stack_fffffffffffffbd6,in_stack_fffffffffffffbd0)),CVar4,
             (string *)in_stack_fffffffffffffbc0);
  local_fa = 0;
  __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdSetPsbtTxInUtxo(
    void* handle, void* psbt_handle, const char* txid, uint32_t vout,
    int64_t amount, const char* locking_script, const char* full_tx_hex) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }
    OutPoint outpoint(Txid(txid), vout);
    auto redeem_script = psbt_obj->psbt->GetTxInRedeemScript(outpoint, true);
    std::vector<KeyData> key_list;
    if (!IsEmptyString(full_tx_hex)) {
      Transaction tx(full_tx_hex);
      psbt_obj->psbt->SetTxInUtxo(outpoint, tx, redeem_script, key_list);
    } else if (!IsEmptyString(locking_script)) {
      Script script(locking_script);
      TxOut txout(Amount(amount), script);
      auto pubkeys = psbt_obj->psbt->GetTxInKeyDataList(outpoint);
      if (script.IsWitnessProgram() || (!redeem_script.IsEmpty()) ||
          (!pubkeys.empty())) {
        psbt_obj->psbt->SetTxInUtxo(
            outpoint, TxOutReference(txout), redeem_script, key_list);
      } else {  // on P2SH-segwit
        psbt_obj->psbt->SetTxInWitnessUtxoDirect(
            outpoint, TxOutReference(txout));
      }
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}